

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBmc.c
# Opt level: O2

void Abc_NtkBmc(Abc_Ntk_t *pNtk,int nFrames,int fInit,int fVerbose)

{
  Ivy_Man_t *pMan;
  Ivy_Man_t *pManAig;
  Ivy_Man_t *p;
  Vec_Ptr_t *vMapping;
  Ivy_FraigParams_t Params;
  Vec_Ptr_t *local_70;
  Ivy_FraigParams_t local_68;
  
  pMan = Abc_NtkIvyBefore(pNtk,0,0);
  pManAig = Ivy_ManFrames(pMan,pNtk->nObjCounts[8],nFrames,fInit,&local_70);
  Ivy_FraigParamsDefault(&local_68);
  local_68.nBTLimitNode = 1000000000;
  local_68.fProve = 0;
  local_68.fVerbose = 0;
  p = Ivy_FraigPerform(pManAig,&local_68);
  printf("Frames have %6d nodes.  ",(ulong)(uint)(pManAig->nObjs[6] + pManAig->nObjs[5]));
  printf("Fraig has %6d nodes.\n",(ulong)(uint)(p->nObjs[6] + p->nObjs[5]));
  free(local_70->pArray);
  free(local_70);
  Ivy_ManStop(p);
  Ivy_ManStop(pManAig);
  Ivy_ManStop(pMan);
  return;
}

Assistant:

void Abc_NtkBmc( Abc_Ntk_t * pNtk, int nFrames, int fInit, int fVerbose )
{
    Ivy_FraigParams_t Params, * pParams = &Params; 
    Ivy_Man_t * pMan, * pFrames, * pFraig;
    Vec_Ptr_t * vMapping;
    // convert to IVY manager
    pMan = Abc_NtkIvyBefore( pNtk, 0, 0 );
    // generate timeframes
    pFrames = Ivy_ManFrames( pMan, Abc_NtkLatchNum(pNtk), nFrames, fInit, &vMapping );
    // fraig the timeframes
    Ivy_FraigParamsDefault( pParams );
    pParams->nBTLimitNode = ABC_INFINITY;
    pParams->fVerbose = 0;
    pParams->fProve = 0;
    pFraig = Ivy_FraigPerform( pFrames, pParams );
printf( "Frames have %6d nodes.  ", Ivy_ManNodeNum(pFrames) );
printf( "Fraig has %6d nodes.\n", Ivy_ManNodeNum(pFraig) );
    // report the classes
//    if ( fVerbose )
//        Abc_NtkBmcReport( pMan, pFrames, pFraig, vMapping, nFrames );
    // free stuff
    Vec_PtrFree( vMapping );
    Ivy_ManStop( pFraig );
    Ivy_ManStop( pFrames );
    Ivy_ManStop( pMan );
}